

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImFontGlyphRangesBuilder::BuildRanges
          (ImFontGlyphRangesBuilder *this,ImVector<unsigned_short> *out_ranges)

{
  uint uVar1;
  int iVar2;
  unsigned_short *puVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  uVar7 = 0;
  do {
    if (((int)uVar7 >> 5 < 0) || (*(int *)this <= (int)uVar7 >> 5)) {
LAB_001a9fca:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/inflex[P]OpenBoardView/src/imgui/imgui.h"
                    ,0x645,
                    "const T &ImVector<unsigned int>::operator[](int) const [T = unsigned int]");
    }
    uVar5 = (ulong)(int)uVar7;
    uVar8 = uVar7;
    if ((*(uint *)(*(long *)(this + 8) + (uVar5 >> 3 & 0x1fffffffc)) >> (uVar7 & 0x1f) & 1) != 0) {
      iVar2 = out_ranges->Capacity;
      if (out_ranges->Size == iVar2) {
        if (iVar2 == 0) {
          iVar4 = 8;
        }
        else {
          iVar4 = iVar2 / 2 + iVar2;
        }
        iVar9 = out_ranges->Size + 1;
        if (iVar9 < iVar4) {
          iVar9 = iVar4;
        }
        if (iVar2 < iVar9) {
          puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar9 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar3,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar3;
          out_ranges->Capacity = iVar9;
        }
      }
      out_ranges->Data[out_ranges->Size] = (unsigned_short)uVar7;
      iVar4 = out_ranges->Size;
      iVar2 = iVar4 + 1;
      out_ranges->Size = iVar2;
      uVar6 = 0xffff;
      if (0xffff < (int)uVar7) {
        uVar6 = uVar7;
      }
      uVar7 = uVar7 - 1;
      do {
        uVar8 = uVar6;
        if (0xfffe < (long)uVar5) break;
        iVar9 = (int)(uVar7 + 2) >> 5;
        if ((iVar9 < 0) || (*(int *)this <= iVar9)) goto LAB_001a9fca;
        uVar5 = uVar5 + 1;
        uVar1 = uVar7 + 2;
        uVar8 = uVar7 + 1;
        uVar7 = uVar8;
      } while ((*(uint *)(*(long *)(this + 8) + (uVar5 >> 3 & 0x1fffffffc)) >> (uVar1 & 0x1f) & 1)
               != 0);
      iVar9 = out_ranges->Capacity;
      if (iVar2 == iVar9) {
        if (iVar9 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar9 / 2 + iVar9;
        }
        iVar4 = iVar4 + 2;
        if (iVar4 < iVar2) {
          iVar4 = iVar2;
        }
        if (iVar9 < iVar4) {
          puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar4 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar3,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar3;
          out_ranges->Capacity = iVar4;
        }
      }
      out_ranges->Data[out_ranges->Size] = (unsigned_short)uVar8;
      out_ranges->Size = out_ranges->Size + 1;
    }
    uVar7 = uVar8 + 1;
    if (0xfffe < (int)uVar8) {
      iVar2 = out_ranges->Capacity;
      if (out_ranges->Size == iVar2) {
        iVar4 = out_ranges->Size + 1;
        if (iVar2 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar2 / 2 + iVar2;
        }
        if (iVar4 < iVar9) {
          iVar4 = iVar9;
        }
        if (iVar2 < iVar4) {
          puVar3 = (unsigned_short *)ImGui::MemAlloc((long)iVar4 * 2);
          if (out_ranges->Data != (unsigned_short *)0x0) {
            memcpy(puVar3,out_ranges->Data,(long)out_ranges->Size * 2);
            ImGui::MemFree(out_ranges->Data);
          }
          out_ranges->Data = puVar3;
          out_ranges->Capacity = iVar4;
        }
      }
      out_ranges->Data[out_ranges->Size] = 0;
      out_ranges->Size = out_ranges->Size + 1;
      return;
    }
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::BuildRanges(ImVector<ImWchar>* out_ranges)
{
    const int max_codepoint = IM_UNICODE_CODEPOINT_MAX;
    for (int n = 0; n <= max_codepoint; n++)
        if (GetBit(n))
        {
            out_ranges->push_back((ImWchar)n);
            while (n < max_codepoint && GetBit(n + 1))
                n++;
            out_ranges->push_back((ImWchar)n);
        }
    out_ranges->push_back(0);
}